

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dmidtex.cpp
# Opt level: O1

void P_Attach3dMidtexLinesToSector(sector_t_conflict *sector,int lineid,int tag,bool ceiling)

{
  byte *pbVar1;
  extsector_t *peVar2;
  line_t_conflict *plVar3;
  int *piVar4;
  splane *psVar5;
  sector_t_conflict *psVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  void *__s;
  void *__s_00;
  ulong uVar10;
  int iVar11;
  long lVar12;
  TArray<line_t_*,_line_t_*> *this;
  long lVar13;
  TArray<sector_t_*,_sector_t_*> *pTVar14;
  ulong uVar15;
  bool bVar16;
  FSectorTagIterator it;
  FSectorTagIterator local_50;
  TArray<sector_t_*,_sector_t_*> *local_48;
  long local_40;
  extsector_t *local_38;
  
  if (tag != 0 || lineid != 0) {
    peVar2 = sector->e;
    uVar15 = (ulong)ceiling;
    local_40 = uVar15 * 0x20;
    pTVar14 = &(&(peVar2->Midtex).Floor)[uVar15].AttachedSectors;
    iVar7 = numlines + 0xe;
    if (-1 < numlines + 7) {
      iVar7 = numlines + 7;
    }
    local_38 = peVar2;
    __s = operator_new__((long)(iVar7 >> 3));
    iVar9 = numsectors + 0xe;
    if (-1 < numsectors + 7) {
      iVar9 = numsectors + 7;
    }
    __s_00 = operator_new__((long)(iVar9 >> 3));
    memset(__s,0,(long)(iVar7 >> 3));
    memset(__s_00,0,(long)(iVar9 >> 3));
    plVar3 = lines;
    if ((&(peVar2->Midtex).Floor)[uVar15].AttachedLines.Count != 0) {
      uVar10 = 0;
      do {
        lVar12 = ((long)(&(peVar2->Midtex).Floor)[uVar15].AttachedLines.Array[uVar10] - (long)plVar3
                 >> 3) * -0x79435e50d79435e5;
        pbVar1 = (byte *)((long)__s + (long)((int)lVar12 >> 3));
        *pbVar1 = *pbVar1 | (byte)(1 << ((byte)lVar12 & 7));
        uVar10 = uVar10 + 1;
      } while (uVar10 < (&(peVar2->Midtex).Floor)[uVar15].AttachedLines.Count);
    }
    psVar6 = sectors;
    if ((&(peVar2->Midtex).Floor)[uVar15].AttachedSectors.Count == 0) {
      bVar16 = true;
    }
    else {
      uVar10 = 0;
      do {
        lVar12 = ((long)((TArray<sector_t_*,_sector_t_*> *)&pTVar14->Array)->Array[uVar10] -
                  (long)psVar6 >> 3) * -0xf4898d5f85bb395;
        pbVar1 = (byte *)((long)__s_00 + (long)((int)lVar12 >> 3));
        *pbVar1 = *pbVar1 | (byte)(1 << ((byte)lVar12 & 7));
        uVar10 = uVar10 + 1;
        uVar8 = (&(peVar2->Midtex).Floor)[uVar15].AttachedSectors.Count;
      } while (uVar10 < uVar8);
      bVar16 = uVar8 == 0;
    }
    if ((&(peVar2->Midtex).Floor)[uVar15].AttachedLines.Count != 0) {
      (&(peVar2->Midtex).Floor)[uVar15].AttachedLines.Count = 0;
    }
    if (!bVar16) {
      (&(peVar2->Midtex).Floor)[uVar15].AttachedSectors.Count = 0;
    }
    local_48 = pTVar14;
    if (tag == 0) {
      local_50.start = tagManager.IDHashFirst[lineid & 0xff];
      local_50.searchtag = lineid;
      uVar8 = FLineIdIterator::Next((FLineIdIterator *)&local_50);
      if (-1 < (int)uVar8) {
        do {
          if (((lines[uVar8].frontsector != (sector_t_conflict *)0x0) &&
              (lines[uVar8].backsector != (sector_t_conflict *)0x0)) &&
             ((lines[uVar8].flags & 0x200000) != 0)) {
            pbVar1 = (byte *)((long)__s + (ulong)(uVar8 >> 3));
            *pbVar1 = *pbVar1 | (byte)(1 << ((byte)uVar8 & 7));
          }
          uVar8 = FLineIdIterator::Next((FLineIdIterator *)&local_50);
        } while (-1 < (int)uVar8);
      }
    }
    else {
      local_50.start = tagManager.TagHashFirst[tag & 0xff];
      local_50.searchtag = tag;
      uVar8 = FSectorTagIterator::Next(&local_50);
      pTVar14 = local_48;
      while (local_48 = pTVar14, -1 < (int)uVar8) {
        if (0 < sectors[uVar8].linecount) {
          lVar12 = 0;
          do {
            plVar3 = sectors[uVar8].lines[lVar12];
            if (((lineid == 0) ||
                (bVar16 = FTagManager::LineHasID(&tagManager,plVar3,lineid), bVar16)) &&
               ((plVar3->frontsector != (sector_t_conflict *)0x0 &&
                ((plVar3->backsector != (sector_t_conflict *)0x0 &&
                 ((plVar3->flags & 0x200000) != 0)))))) {
              lVar13 = ((long)plVar3 - (long)lines >> 3) * -0x79435e50d79435e5;
              pbVar1 = (byte *)((long)__s + (long)((int)lVar13 >> 3));
              *pbVar1 = *pbVar1 | (byte)(1 << ((byte)lVar13 & 7));
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < sectors[uVar8].linecount);
        }
        uVar8 = FSectorTagIterator::Next(&local_50);
        pTVar14 = local_48;
      }
    }
    if (0 < numlines) {
      this = (TArray<line_t_*,_line_t_*> *)
             ((long)&(local_38->Midtex).Floor.AttachedLines.Array + local_40);
      lVar12 = 0;
      uVar15 = 0;
      do {
        if ((*(byte *)((long)__s + (uVar15 >> 3 & 0x1fffffff)) >> ((uint)uVar15 & 7) & 1) != 0) {
          piVar4 = lines->args;
          TArray<line_t_*,_line_t_*>::Grow(this,1);
          uVar8 = pTVar14[1].Count;
          pTVar14[1].Array[uVar8] = (sector_t_conflict *)((long)piVar4 + lVar12 + -0x2c);
          pTVar14[1].Count = uVar8 + 1;
          plVar3 = lines;
          psVar6 = sectors;
          iVar7 = numsectors;
          iVar9 = (int)((ulong)(*(long *)((long)lines->bbox + lVar12 + 0x20) - (long)sectors) >> 3);
          iVar11 = iVar9 * 0x7a44c6b;
          if (numsectors == iVar11 ||
              SBORROW4(numsectors,iVar11) != numsectors + iVar9 * -0x7a44c6b < 0) {
            __assert_fail("v < numsectors",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_3dmidtex.cpp"
                          ,0xc3,"void P_Attach3dMidtexLinesToSector(sector_t *, int, int, bool)");
          }
          pbVar1 = (byte *)((long)__s_00 + (long)(iVar11 >> 3));
          *pbVar1 = *pbVar1 | (byte)(1 << ((byte)iVar11 & 7));
          iVar11 = (int)((ulong)(*(long *)((long)plVar3->bbox + lVar12 + 0x28) - (long)psVar6) >> 3)
          ;
          iVar9 = iVar11 * 0x7a44c6b;
          if (iVar7 == iVar9 || SBORROW4(iVar7,iVar9) != iVar7 + iVar11 * -0x7a44c6b < 0) {
            __assert_fail("v < numsectors",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_3dmidtex.cpp"
                          ,199,"void P_Attach3dMidtexLinesToSector(sector_t *, int, int, bool)");
          }
          pbVar1 = (byte *)((long)__s_00 + (long)(iVar9 >> 3));
          *pbVar1 = *pbVar1 | (byte)(1 << ((byte)iVar9 & 7));
        }
        uVar15 = uVar15 + 1;
        lVar12 = lVar12 + 0x98;
      } while ((long)uVar15 < (long)numlines);
    }
    pTVar14 = local_48;
    if (0 < numsectors) {
      lVar12 = 0;
      uVar15 = 0;
      do {
        if ((*(byte *)((long)__s_00 + (uVar15 >> 3 & 0x1fffffff)) >> ((uint)uVar15 & 7) & 1) != 0) {
          psVar5 = sectors->planes;
          TArray<sector_t_*,_sector_t_*>::Grow(pTVar14,1);
          uVar8 = pTVar14->Count;
          pTVar14->Array[uVar8] = (sector_t_conflict *)((long)&(psVar5->xform).xOffs + lVar12);
          pTVar14->Count = uVar8 + 1;
        }
        uVar15 = uVar15 + 1;
        lVar12 = lVar12 + 0x218;
      } while ((long)uVar15 < (long)numsectors);
    }
    operator_delete__(__s);
    operator_delete__(__s_00);
  }
  return;
}

Assistant:

void P_Attach3dMidtexLinesToSector(sector_t *sector, int lineid, int tag, bool ceiling)
{
	int v;

	if (lineid == 0 && tag == 0)
	{
		// invalid set of parameters
		return;
	}

	extsector_t::midtex::plane &scrollplane = ceiling? sector->e->Midtex.Ceiling : sector->e->Midtex.Floor;

	// Bit arrays that mark whether a line or sector is to be attached.
	BYTE *found_lines = new BYTE[(numlines+7)/8];
	BYTE *found_sectors = new BYTE[(numsectors+7)/8];

	memset(found_lines, 0, sizeof (BYTE) * ((numlines+7)/8));
	memset(found_sectors, 0, sizeof (BYTE) * ((numsectors+7)/8));

	// mark all lines and sectors that are already attached to this one
	// and clear the arrays. The old data will be re-added automatically
	// from the marker arrays.
	for (unsigned i=0; i < scrollplane.AttachedLines.Size(); i++)
	{
		int line = int(scrollplane.AttachedLines[i] - lines);
		found_lines[line>>3] |= 1 << (line&7);
	}

	for (unsigned i=0; i < scrollplane.AttachedSectors.Size(); i++)
	{
		int sec = int(scrollplane.AttachedSectors[i] - sectors);
		found_sectors[sec>>3] |= 1 << (sec&7);
	}

	scrollplane.AttachedLines.Clear();
	scrollplane.AttachedSectors.Clear();

	if (tag == 0)
	{
		FLineIdIterator itr(lineid);
		int line;
		while ((line = itr.Next()) >= 0)
		{
			line_t *ln = &lines[line];

			if (ln->frontsector == NULL || ln->backsector == NULL || !(ln->flags & ML_3DMIDTEX))
			{
				// Only consider two-sided lines with the 3DMIDTEX flag
				continue;
			}
			found_lines[line>>3] |= 1 << (line&7);
		}
	}
	else
	{
		FSectorTagIterator it(tag);
		int sec;
		while ((sec = it.Next()) >= 0)
		{
			for (int line = 0; line < sectors[sec].linecount; line ++)
			{
				line_t *ln = sectors[sec].lines[line];

				if (lineid != 0 && !tagManager.LineHasID(ln, lineid)) continue;

				if (ln->frontsector == NULL || ln->backsector == NULL || !(ln->flags & ML_3DMIDTEX))
				{
					// Only consider two-sided lines with the 3DMIDTEX flag
					continue;
				}
				int lineno = int(ln-lines);
				found_lines[lineno>>3] |= 1 << (lineno&7);
			}
		}
	}


	for(int i=0; i < numlines; i++)
	{
		if (found_lines[i>>3] & (1 << (i&7)))
		{
			scrollplane.AttachedLines.Push(&lines[i]);

			v = int(lines[i].frontsector - sectors);
			assert(v < numsectors);
			found_sectors[v>>3] |= 1 << (v&7);

			v = int(lines[i].backsector - sectors);
			assert(v < numsectors);
			found_sectors[v>>3] |= 1 << (v&7);
		}
	}

	for (int i=0; i < numsectors; i++)
	{
		if (found_sectors[i>>3] & (1 << (i&7)))
		{
			scrollplane.AttachedSectors.Push(&sectors[i]);
		}
	}

	delete[] found_lines;
	delete[] found_sectors;
}